

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_cbegin_cend_forward_Test::
~IntrusiveListIteratorTest_cbegin_cend_forward_Test
          (IntrusiveListIteratorTest_cbegin_cend_forward_Test *this)

{
  IntrusiveListIteratorTest_cbegin_cend_forward_Test *this_local;
  
  ~IntrusiveListIteratorTest_cbegin_cend_forward_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, cbegin_cend_forward) {
  TestForward(list_.cbegin(), list_.cend(), {1, 2, 3});
  TestForward(clist_.cbegin(), clist_.cend(), {1, 2, 3});
}